

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper-api.c
# Opt level: O1

int tlv_parse_data(uint8_t *buf,size_t buflen,int argc,...)

{
  uint8_t *puVar1;
  ulong *puVar2;
  undefined8 uVar3;
  bool bVar4;
  char in_AL;
  int iVar5;
  uint8_t *puVar6;
  undefined4 *puVar7;
  int *piVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long *plVar11;
  uint64_t *puVar12;
  uint8_t *puVar13;
  undefined8 in_RCX;
  uint64_t uVar14;
  ulong uVar15;
  ulong uVar16;
  uint32_t block_size;
  ulong uVar17;
  undefined8 in_R8;
  long lVar18;
  undefined8 in_R9;
  int iVar19;
  int iVar20;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [24];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined4 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  uint8_t *local_90;
  ulong local_88;
  ndn_hmac_key_t *local_80;
  size_t local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  uint8_t *local_60;
  undefined8 *local_58;
  uint32_t local_50;
  uint local_4c;
  uint32_t block_type;
  uint32_t block_len;
  va_list vl;
  
  local_70 = (undefined8 *)CONCAT44(local_70._4_4_,argc);
  if (in_AL != '\0') {
    local_118 = in_XMM0_Da;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  local_130 = in_RCX;
  local_128 = in_R8;
  local_120 = in_R9;
  local_78 = buflen;
  puVar6 = tlv_get_type_length(buf,buflen,&local_50,&local_4c);
  if (puVar6 == (uint8_t *)0x0) {
    iVar5 = -0xe;
  }
  else {
    iVar5 = -0xc;
    if (local_50 == 6) {
      local_60 = buf + local_78;
      iVar5 = -0xd;
      if (puVar6 + local_4c == local_60) {
        iVar5 = ndn_data_tlv_decode_no_verify
                          (&tlv_parse_data::data,buf,(uint32_t)local_78,(uint32_t *)0x0,
                           (uint32_t *)0x0);
        if (iVar5 == 0) {
          vl[0].overflow_arg_area = local_148;
          vl[0]._0_8_ = &stack0x00000008;
          _block_type = 0x3000000018;
          puVar13 = local_60;
          if ((int)local_70 < 1) {
            bVar4 = true;
            local_58 = (undefined8 *)0x0;
            puVar9 = (undefined8 *)0x0;
            local_68 = (undefined8 *)0x0;
            local_80 = (ndn_hmac_key_t *)0x0;
            local_88 = 0;
            iVar5 = 0;
          }
          else {
            local_88 = 0;
            local_80 = (ndn_hmac_key_t *)0x0;
            local_68 = (undefined8 *)0x0;
            puVar9 = (undefined8 *)0x0;
            local_58 = (undefined8 *)0x0;
            iVar20 = 0;
            iVar19 = (int)local_70;
            local_90 = puVar6;
            do {
              uVar16 = _block_type & 0xffffffff;
              if (uVar16 < 0x29) {
                _block_type = CONCAT44(block_len,block_type + 8);
                puVar7 = (undefined4 *)(uVar16 + (long)vl[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined4 *)vl[0]._0_8_;
                vl[0]._0_8_ = vl[0]._0_8_ + 8;
              }
              iVar5 = -0x12;
              bVar4 = false;
              switch(*puVar7) {
              case 0:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  puVar10 = (undefined8 *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  puVar10 = (undefined8 *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                if ((void *)*puVar10 != (void *)0x0) {
                  memcpy((void *)*puVar10,&tlv_parse_data::data,0x1bc);
                  puVar13 = local_60;
                  puVar6 = local_90;
                  iVar19 = (int)local_70;
                  break;
                }
LAB_001126b8:
                iVar5 = -0x10;
                bVar4 = false;
                goto switchD_001121fe_caseD_b;
              case 1:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  local_58 = (undefined8 *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  local_58 = (undefined8 *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                local_58 = (undefined8 *)*local_58;
                bVar4 = false;
                if (local_58 == (undefined8 *)0x0) {
                  iVar5 = -0x10;
                  local_58 = (undefined8 *)0x0;
                }
                else {
                  *local_58 = 0;
LAB_001126e3:
                  bVar4 = true;
                  iVar5 = 0;
                }
                goto switchD_001121fe_caseD_b;
              case 2:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  plVar11 = (long *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  plVar11 = (long *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                if ((ulong *)*plVar11 == (ulong *)0x0) goto LAB_001126b8;
                if (tlv_parse_data::data.name.components_size == 0) {
                  bVar4 = false;
                  iVar5 = -0x11;
                }
                else {
                  uVar16 = (ulong)(tlv_parse_data::data.name.components_size - 1);
                  uVar15 = 0xffffffffffffffff;
                  if (((tlv_parse_data::data.name.components[uVar16].type == 8) &&
                      (uVar17 = (ulong)tlv_parse_data::data.name.components[uVar16].size, 1 < uVar17
                      )) && (tlv_parse_data::data.name.components[uVar16].value[0] == '\0')) {
                    lVar18 = 0;
                    uVar15 = 0;
                    do {
                      uVar15 = uVar15 << 8 | (ulong)*(byte *)(uVar16 * 0x2c + 0x135b65 + lVar18);
                      lVar18 = lVar18 + 1;
                    } while (uVar17 - 1 != lVar18);
                  }
                  *(ulong *)*plVar11 = uVar15;
LAB_00112687:
                  iVar5 = 0;
                  bVar4 = true;
                }
                goto switchD_001121fe_caseD_b;
              case 3:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  puVar10 = (undefined8 *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  puVar10 = (undefined8 *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                puVar1 = (uint8_t *)*puVar10;
                if (puVar1 == (uint8_t *)0x0) goto LAB_001126b8;
                if (tlv_parse_data::data.metainfo.enable_ContentType == '\0') {
                  *puVar1 = 0xff;
                }
                else {
                  *puVar1 = tlv_parse_data::data.metainfo.content_type;
                }
                break;
              case 4:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  puVar10 = (undefined8 *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  puVar10 = (undefined8 *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                puVar12 = (uint64_t *)*puVar10;
                if (puVar12 == (uint64_t *)0x0) goto LAB_001126b8;
                uVar14 = tlv_parse_data::data.metainfo.freshness_period;
                if (tlv_parse_data::data.metainfo.enable_FreshnessPeriod == '\0') goto LAB_001126ea;
LAB_0011244f:
                *puVar12 = uVar14;
                break;
              case 5:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  plVar11 = (long *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  plVar11 = (long *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                puVar10 = (undefined8 *)*plVar11;
                if (puVar10 == (undefined8 *)0x0) goto LAB_001126b8;
                if (tlv_parse_data::data.metainfo.enable_FinalBlockId == '\0') {
                  *(undefined1 *)(puVar10 + 5) = 0;
                }
                else {
                  uVar3 = CONCAT44(tlv_parse_data::data.metainfo.final_block_id._40_4_,
                                   tlv_parse_data::data.metainfo.final_block_id.value._32_4_);
                  *(ulong *)((long)puVar10 + 0x1c) =
                       CONCAT44(tlv_parse_data::data.metainfo.final_block_id.value._28_4_,
                                tlv_parse_data::data.metainfo.final_block_id.value._24_4_);
                  *(undefined8 *)((long)puVar10 + 0x24) = uVar3;
                  uVar3 = CONCAT44(tlv_parse_data::data.metainfo.final_block_id.value._24_4_,
                                   tlv_parse_data::data.metainfo.final_block_id.value._20_4_);
                  puVar10[2] = tlv_parse_data::data.metainfo.final_block_id.value._12_8_;
                  puVar10[3] = uVar3;
                  uVar3 = tlv_parse_data::data.metainfo.final_block_id.value._4_8_;
                  *puVar10 = CONCAT44(tlv_parse_data::data.metainfo.final_block_id.value._0_4_,
                                      tlv_parse_data::data.metainfo.final_block_id.type);
                  puVar10[1] = uVar3;
                }
                break;
              case 6:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  puVar9 = (undefined8 *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  puVar9 = (undefined8 *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                puVar9 = (undefined8 *)*puVar9;
                bVar4 = false;
                if (puVar9 != (undefined8 *)0x0) {
                  *puVar9 = 0;
                  goto LAB_001126e3;
                }
                iVar5 = -0x10;
                puVar9 = (undefined8 *)0x0;
                goto switchD_001121fe_caseD_b;
              case 7:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  puVar10 = (undefined8 *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  puVar10 = (undefined8 *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                puVar2 = (ulong *)*puVar10;
                if (puVar2 == (ulong *)0x0) goto LAB_001126b8;
                if (tlv_parse_data::data.metainfo.enable_FinalBlockId != '\0') {
                  uVar16 = 0xffffffffffffffff;
                  if (((tlv_parse_data::data.metainfo.final_block_id.type == 8) &&
                      (1 < (ulong)(tlv_parse_data::data.metainfo.final_block_id._40_4_ & 0xff))) &&
                     (tlv_parse_data::data.metainfo.final_block_id.value[0] == '\0')) {
                    lVar18 = 0;
                    uVar16 = 0;
                    do {
                      uVar16 = uVar16 << 8 |
                               (ulong)tlv_parse_data::data.metainfo.final_block_id.value[lVar18 + 1]
                      ;
                      lVar18 = lVar18 + 1;
                    } while ((ulong)(tlv_parse_data::data.metainfo.final_block_id._40_4_ & 0xff) - 1
                             != lVar18);
                  }
                  *puVar2 = uVar16;
                  goto LAB_00112687;
                }
                *puVar2 = 0xffffffffffffffff;
                break;
              case 8:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  local_68 = (undefined8 *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  local_68 = (undefined8 *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                local_68 = (undefined8 *)*local_68;
                bVar4 = false;
                if (local_68 != (undefined8 *)0x0) {
                  *local_68 = 0;
                  goto LAB_001126e3;
                }
                iVar5 = -0x10;
                local_68 = (undefined8 *)0x0;
                goto switchD_001121fe_caseD_b;
              case 9:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  plVar11 = (long *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  plVar11 = (long *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                if ((ulong *)*plVar11 == (ulong *)0x0) goto LAB_001126b8;
                *(ulong *)*plVar11 = (ulong)tlv_parse_data::data.content_size;
                break;
              case 10:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  plVar11 = (long *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  plVar11 = (long *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                if ((uint8_t *)*plVar11 == (uint8_t *)0x0) goto LAB_001126b8;
                *(uint8_t *)*plVar11 = tlv_parse_data::data.signature.sig_type;
                break;
              default:
                goto switchD_001121fe_caseD_b;
              case 0xc:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  puVar10 = (undefined8 *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  puVar10 = (undefined8 *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                local_80 = (ndn_hmac_key_t *)*puVar10;
                break;
              case 0xd:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  puVar10 = (undefined8 *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  puVar10 = (undefined8 *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                puVar12 = (uint64_t *)*puVar10;
                if (puVar12 == (uint64_t *)0x0) goto LAB_001126b8;
                uVar14 = tlv_parse_data::data.signature.timestamp;
                if (tlv_parse_data::data.signature.enable_Timestamp != '\0') goto LAB_0011244f;
LAB_001126ea:
                *puVar12 = 0;
                break;
              case 0xe:
                uVar16 = _block_type & 0xffffffff;
                if (uVar16 < 0x29) {
                  _block_type = CONCAT44(block_len,block_type + 8);
                  piVar8 = (int *)(uVar16 + (long)vl[0].overflow_arg_area);
                }
                else {
                  piVar8 = (int *)vl[0]._0_8_;
                  vl[0]._0_8_ = vl[0]._0_8_ + 8;
                }
                local_88 = CONCAT71((int7)((ulong)piVar8 >> 8),*piVar8 != 0);
              }
              iVar5 = 0;
              bVar4 = true;
switchD_001121fe_caseD_b:
            } while ((bVar4) && (iVar20 = iVar20 + 1, iVar20 < iVar19));
          }
          if (bVar4) {
            local_70 = puVar9;
            puVar13 = tlv_get_type_length(puVar6,(long)puVar13 - (long)puVar6,&local_50,&local_4c);
            iVar5 = -0x11;
            if (local_50 == 7) {
              if (local_58 != (undefined8 *)0x0) {
                *local_58 = puVar6;
              }
              puVar13 = puVar13 + local_4c;
              if ((tlv_parse_data::data.metainfo.enable_FinalBlockId != '\0') &&
                 (local_70 != (undefined8 *)0x0)) {
                puVar6 = tlv_get_type_length(puVar13,(long)local_60 - (long)puVar13,&local_50,
                                             &local_4c);
                if (local_50 != 0x14) {
                  return -0x11;
                }
                puVar13 = puVar6 + local_4c;
                if ((ulong)local_4c != 0) {
                  do {
                    puVar6 = tlv_get_type_length(puVar6,(long)local_60 - (long)puVar6,&local_50,
                                                 &local_4c);
                    if (local_50 == 0x1a) {
                      *local_70 = puVar6;
                    }
                    puVar6 = puVar6 + local_4c;
                  } while (puVar6 < puVar13);
                }
              }
              if ((local_68 != (undefined8 *)0x0) && (tlv_parse_data::data.content_size != 0)) {
                do {
                  puVar6 = tlv_get_type_length(puVar13,(long)local_60 - (long)puVar13,&local_50,
                                               &local_4c);
                  if (local_50 == 0x15) break;
                  puVar13 = puVar6 + local_4c;
                } while (puVar13 < local_60);
                *local_68 = puVar6;
              }
              iVar5 = 0;
              if ((local_88 & 1) != 0) {
                block_size = (uint32_t)local_78;
                if (tlv_parse_data::data.signature.sig_type == '\x04') {
                  if (local_80 != (ndn_hmac_key_t *)0x0) {
                    iVar5 = ndn_data_tlv_decode_hmac_verify
                                      (&tlv_parse_data::data,buf,block_size,local_80);
                    return iVar5;
                  }
                }
                else {
                  if (tlv_parse_data::data.signature.sig_type != '\x03') {
                    if (tlv_parse_data::data.signature.sig_type != '\0') {
                      return -0x1a;
                    }
                    iVar5 = ndn_data_tlv_decode_digest_verify(&tlv_parse_data::data,buf,block_size);
                    return iVar5;
                  }
                  if (local_80 != (ndn_hmac_key_t *)0x0) {
                    iVar5 = ndn_data_tlv_decode_ecdsa_verify
                                      (&tlv_parse_data::data,buf,block_size,
                                       (ndn_ecc_pub_t *)local_80);
                    return iVar5;
                  }
                }
                iVar5 = -0x10;
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int
tlv_parse_data(uint8_t* buf, size_t buflen, int argc, ...)
{
  static ndn_data_t data;
  va_list vl;
  int i, ret = NDN_SUCCESS;
  enum TLV_DATAARG_TYPE argtype;
  uint32_t block_type, block_len;
  uint8_t *ptr, *valptr, *end = buf + buflen;
  uint8_t **namebuf_ptr = NULL;
  uint8_t **finalblockid_ptr = NULL;
  uint8_t **content_ptr = NULL;
  void *arg_ptr = NULL;
  void *key_ptr = NULL;
  bool verify_sig = false;

  // Check type and length
  ptr = tlv_get_type_length(buf, buflen, &block_type, &block_len);
  if (ptr == NULL) {
    return NDN_OVERSIZE_VAR;
  }
  if (block_type != TLV_Data) {
    return NDN_WRONG_TLV_TYPE;
  }
  if (ptr + block_len != end) {
    return NDN_WRONG_TLV_LENGTH;
  }

  // Decode data
  ret = ndn_data_tlv_decode_no_verify(&data, buf, buflen, NULL, NULL);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Parse args
  va_start(vl, argc);
  for(i = 0; i < argc && ret == NDN_SUCCESS; i ++) {
    argtype = va_arg(vl, int);
    switch(argtype) {
      case TLV_DATAARG_NAME_PTR:
        arg_ptr = va_arg(vl, ndn_name_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(ndn_name_t*)arg_ptr = data.name;
        break;

      case TLV_DATAARG_NAME_BUF:
        namebuf_ptr = va_arg(vl, uint8_t**);
        if (namebuf_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *namebuf_ptr = NULL;
        break;

      case TLV_DATAARG_NAME_SEGNO_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.name.components_size > 0) {
          *(uint64_t*)arg_ptr = tlv_decode_segno(&data.name.components[data.name.components_size - 1]);
        }
        else {
          ret = NDN_UNSUPPORTED_FORMAT;
        }
        break;

      case TLV_DATAARG_CONTENTTYPE_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_ContentType) {
          *(uint8_t*)arg_ptr = data.metainfo.content_type;
        }
        else {
          *(uint8_t*)arg_ptr = 0xFF;
        }
        break;

      case TLV_DATAARG_FRESHNESSPERIOD_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FreshnessPeriod) {
          *(uint64_t*)arg_ptr = data.metainfo.freshness_period;
        }
        else {
          *(uint64_t*)arg_ptr = 0;
        }
        break;

      case TLV_DATAARG_FINALBLOCKID_PTR:
        arg_ptr = va_arg(vl, name_component_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FinalBlockId) {
          *(name_component_t*)arg_ptr = data.metainfo.final_block_id;
        }
        else {
          ((name_component_t*)arg_ptr)->size = 0;
        }
        break;

      case TLV_DATAARG_FINALBLOCKID_BUF:
        finalblockid_ptr = va_arg(vl, uint8_t**);
        if (finalblockid_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *finalblockid_ptr = NULL;
        break;

      case TLV_DATAARG_FINALBLOCKID_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        if (data.metainfo.enable_FinalBlockId) {
          *(uint64_t*)arg_ptr = tlv_decode_segno(&data.metainfo.final_block_id);
        }
        else {
          *(uint64_t*)arg_ptr = (uint64_t)-1;
        }
        break;

      case TLV_DATAARG_CONTENT_BUF:
        content_ptr = va_arg(vl, uint8_t**);
        if (content_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *content_ptr = NULL;
        break;

      case TLV_DATAARG_CONTENT_SIZE:
        arg_ptr = va_arg(vl, size_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(size_t*)arg_ptr = (size_t)data.content_size;
        break;

      case TLV_DATAARG_SIGTYPE_U8:
        arg_ptr = va_arg(vl, uint8_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
          break;
        }
        *(uint8_t*)arg_ptr = data.signature.sig_type;
        break;

      case TLV_DATAARG_SIGKEY_PTR:
        key_ptr = va_arg(vl, void*);
        break;

      case TLV_DATAARG_SIGTIME_U64:
        arg_ptr = va_arg(vl, uint64_t*);
        if (arg_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else if (data.signature.enable_Timestamp) {
          *(uint64_t*)arg_ptr = data.signature.timestamp;
        }
        else {
          *(uint64_t*)arg_ptr = 0;
        }
        break;

      case TLV_DATAARG_VERIFY:
        verify_sig = va_arg(vl, uint32_t);
        break;

      default:
        ret = NDN_INVALID_ARG;
        break;
    }
  }
  va_end(vl);
  if (ret != NDN_SUCCESS) {
    return ret;
  }

  // Decode Name (No need to check for NULL since decoding succeeded)
  valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
  if (block_type != TLV_Name) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  if (namebuf_ptr != NULL) {
    *namebuf_ptr = ptr;
  }
  ptr = valptr + block_len;

  // Metainfo if applicable
  if (data.metainfo.enable_FinalBlockId && finalblockid_ptr != NULL) {
    valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
    if (block_type != TLV_MetaInfo) {
      return NDN_UNSUPPORTED_FORMAT;
    }
    ptr = valptr + block_len;

    while(valptr < ptr) {
      valptr = tlv_get_type_length(valptr, end - valptr, &block_type, &block_len);
      if (block_type == TLV_FinalBlockId) {
        *finalblockid_ptr = valptr;
      }
      valptr += block_len;
    }
  }

  // Content if applicable
  if (content_ptr && data.content_size > 0) {
    do{
      valptr = tlv_get_type_length(ptr, end - ptr, &block_type, &block_len);
      ptr = valptr + block_len;
    }while(block_type != TLV_Content && ptr < end);
    *content_ptr = valptr;
  }

  // Verify if required
  if (verify_sig) {
    switch(data.signature.sig_type) {
      case NDN_SIG_TYPE_DIGEST_SHA256:
        ret = ndn_data_tlv_decode_digest_verify(&data, buf, buflen);
        break;

      case NDN_SIG_TYPE_ECDSA_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_data_tlv_decode_ecdsa_verify(&data, buf, buflen, (ndn_ecc_pub_t*)key_ptr);
        }
        break;

      case NDN_SIG_TYPE_HMAC_SHA256:
        if (key_ptr == NULL) {
          ret = NDN_INVALID_POINTER;
        }
        else {
          ret = ndn_data_tlv_decode_hmac_verify(&data, buf, buflen, (ndn_hmac_key_t*)key_ptr);
        }
        break;

      default:
        ret = NDN_SEC_UNSUPPORT_SIGN_TYPE;
        break;
    }
  }

  return ret;
}